

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

CpuSet * ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  CpuSet *pCVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  int i;
  ulong uVar11;
  byte bVar12;
  int freq_khz;
  uint local_15c;
  int local_158;
  int local_154;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  char path [256];
  
  bVar12 = 0;
  _DAT_00333308 = 0;
  uRam0000000000333310 = 0;
  _DAT_003332f8 = 0;
  uRam0000000000333300 = 0;
  _DAT_003332e8 = 0;
  uRam00000000003332f0 = 0;
  _DAT_003332d8 = 0;
  uRam00000000003332e0 = 0;
  _DAT_003332c8 = 0;
  uRam00000000003332d0 = 0;
  _DAT_003332b8 = 0;
  uRam00000000003332c0 = 0;
  _DAT_003332a8 = 0;
  uRam00000000003332b0 = 0;
  g_thread_affinity_mask_all = 0;
  DAT_003332a0 = 0;
  local_15c = powersave;
  std::vector<int,_std::allocator<int>_>::vector
            (&cpu_max_freq_khz,(long)(int)g_cpucount,(allocator_type *)path);
  iVar1 = 0x7fffffff;
  uVar11 = 0;
  iVar2 = 0;
  do {
    if ((long)(int)g_cpucount <= (long)uVar11) {
      iVar1 = (iVar1 + iVar2) / 2;
      if (iVar1 == iVar2) {
        _DAT_00333388 = 0;
        uRam0000000000333390 = 0;
        _DAT_00333378 = 0;
        uRam0000000000333380 = 0;
        _DAT_00333368 = 0;
        uRam0000000000333370 = 0;
        _DAT_00333358 = 0;
        uRam0000000000333360 = 0;
        _DAT_00333348 = 0;
        uRam0000000000333350 = 0;
        _DAT_00333338 = 0;
        uRam0000000000333340 = 0;
        _DAT_00333328 = 0;
        uRam0000000000333330 = 0;
        g_thread_affinity_mask_little = 0;
        uRam0000000000333320 = 0;
        puVar10 = &g_thread_affinity_mask_all;
        puVar9 = &g_thread_affinity_mask_big;
        for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar9 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
          puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
        }
      }
      else {
        uVar11 = 0;
        uVar8 = (ulong)g_cpucount;
        if ((int)g_cpucount < 1) {
          uVar8 = 0;
        }
        for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          if (uVar11 < 0x400) {
            puVar10 = &g_thread_affinity_mask_big;
            if (cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11] < iVar1) {
              puVar10 = &g_thread_affinity_mask_little;
            }
            puVar10[uVar11 >> 6] = puVar10[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>);
      if (local_15c < 3) {
        pCVar5 = (CpuSet *)(&PTR_g_thread_affinity_mask_all_00332c70)[local_15c];
      }
      else {
        fprintf(_stderr,"powersave %d not supported");
        fputc(10,_stderr);
        pCVar5 = (CpuSet *)&g_thread_affinity_mask_all;
      }
      return pCVar5;
    }
    local_158 = iVar2;
    local_154 = iVar1;
    sprintf(path,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",uVar11 & 0xffffffff);
    pFVar4 = fopen(path,"rb");
    if (pFVar4 == (FILE *)0x0) {
      sprintf(path,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",uVar11 & 0xffffffff);
      pFVar4 = fopen(path,"rb");
      if (pFVar4 != (FILE *)0x0) {
        iVar1 = 0;
        do {
          iVar7 = iVar1;
          iVar1 = feof(pFVar4);
          if (iVar1 != 0) break;
          freq_khz = 0;
          iVar2 = __isoc99_fscanf(pFVar4,"%d %*d",&freq_khz);
          iVar1 = freq_khz;
          if (freq_khz <= iVar7) {
            iVar1 = iVar7;
          }
        } while (iVar2 == 1);
        fclose(pFVar4);
        if (iVar7 != 0) goto LAB_002d759b;
      }
      sprintf(path,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",uVar11 & 0xffffffff);
      pFVar4 = fopen(path,"rb");
      iVar7 = -1;
      if (pFVar4 != (FILE *)0x0) {
        freq_khz = -1;
        uVar3 = __isoc99_fscanf(pFVar4,"%d",&freq_khz);
        if (uVar3 != 1) {
          fprintf(_stderr,"fscanf cpuinfo_max_freq error %d",(ulong)uVar3);
          fputc(10,_stderr);
        }
        fclose(pFVar4);
        iVar7 = freq_khz;
      }
    }
    else {
      iVar1 = 0;
      do {
        iVar7 = iVar1;
        iVar1 = feof(pFVar4);
        if (iVar1 != 0) break;
        freq_khz = 0;
        iVar2 = __isoc99_fscanf(pFVar4,"%d %*d",&freq_khz);
        iVar1 = freq_khz;
        if (freq_khz <= iVar7) {
          iVar1 = iVar7;
        }
      } while (iVar2 == 1);
      fclose(pFVar4);
    }
LAB_002d759b:
    cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar11] = iVar7;
    iVar2 = local_158;
    if (local_158 < iVar7) {
      iVar2 = iVar7;
    }
    iVar1 = local_154;
    if (iVar7 < local_154) {
      iVar1 = iVar7;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

const CpuSet& get_cpu_thread_affinity_mask(int powersave)
{
    setup_thread_affinity_masks();

    if (powersave == 0)
        return g_thread_affinity_mask_all;

    if (powersave == 1)
        return g_thread_affinity_mask_little;

    if (powersave == 2)
        return g_thread_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_thread_affinity_mask_all;
}